

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_constants_melee_critical_level(parser *p)

{
  undefined8 *puVar1;
  int iVar2;
  wchar_t wVar3;
  parser_error pVar4;
  void *pvVar5;
  char *name;
  undefined8 *puVar6;
  undefined8 *puVar7;
  
  pvVar5 = parser_priv(p);
  name = parser_getstr(p,"msg");
  iVar2 = message_lookup_by_name(name);
  if (iVar2 < 0) {
    pVar4 = PARSE_ERROR_INVALID_MESSAGE;
  }
  else {
    puVar6 = (undefined8 *)mem_alloc(0x18);
    *puVar6 = 0;
    wVar3 = parser_getint(p,"cutoff");
    *(wchar_t *)(puVar6 + 1) = wVar3;
    wVar3 = parser_getint(p,"mult");
    *(wchar_t *)((long)puVar6 + 0xc) = wVar3;
    wVar3 = parser_getint(p,"add");
    *(wchar_t *)(puVar6 + 2) = wVar3;
    *(int *)((long)puVar6 + 0x14) = iVar2;
    puVar1 = *(undefined8 **)((long)pvVar5 + 0xc0);
    if (*(undefined8 **)((long)pvVar5 + 0xc0) == (undefined8 *)0x0) {
      puVar7 = (undefined8 *)((long)pvVar5 + 0xc0);
    }
    else {
      do {
        puVar7 = puVar1;
        puVar1 = (undefined8 *)*puVar7;
      } while ((undefined8 *)*puVar7 != (undefined8 *)0x0);
    }
    *puVar7 = puVar6;
    pVar4 = PARSE_ERROR_NONE;
  }
  return pVar4;
}

Assistant:

static enum parser_error parse_constants_melee_critical_level(struct parser *p)
{
	struct angband_constants *z = parser_priv(p);
	struct critical_level *new_level;
	const char *msgt_str = parser_getstr(p, "msg");
	int msgt = message_lookup_by_name(msgt_str);

	if (msgt < 0) {
		return PARSE_ERROR_INVALID_MESSAGE;
	}
	new_level = mem_alloc(sizeof(*new_level));
	new_level->next = NULL;
	new_level->cutoff = parser_getint(p, "cutoff");
	new_level->mult = parser_getint(p, "mult");
	new_level->add = parser_getint(p, "add");
	new_level->msgt = msgt;
	/* Add it to the end of the linked list. */
	if (z->m_crit_level_head) {
		struct critical_level *cursor = z->m_crit_level_head;

		while (cursor->next) {
			cursor = cursor->next;
		}
		cursor->next = new_level;
	} else {
		z->m_crit_level_head = new_level;
	}

	return PARSE_ERROR_NONE;
}